

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ConjunctionExpression::Deserialize(ConjunctionExpression *this,Deserializer *deserializer)

{
  ExpressionType type;
  tuple<duckdb::ConjunctionExpression_*,_std::default_delete<duckdb::ConjunctionExpression>_>
  this_00;
  pointer pCVar1;
  __uniq_ptr_impl<duckdb::ConjunctionExpression,_std::default_delete<duckdb::ConjunctionExpression>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::ConjunctionExpression_*,_std::default_delete<duckdb::ConjunctionExpression>_>
  .super__Head_base<0UL,_duckdb::ConjunctionExpression_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ConjunctionExpression_*,_std::default_delete<duckdb::ConjunctionExpression>_>
        )operator_new(0x50);
  type = SerializationData::Get<duckdb::ExpressionType>(&deserializer->data);
  ConjunctionExpression
            ((ConjunctionExpression *)
             this_00.
             super__Tuple_impl<0UL,_duckdb::ConjunctionExpression_*,_std::default_delete<duckdb::ConjunctionExpression>_>
             .super__Head_base<0UL,_duckdb::ConjunctionExpression_*,_false>._M_head_impl,type);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::ConjunctionExpression_*,_std::default_delete<duckdb::ConjunctionExpression>_>
  .super__Head_base<0UL,_duckdb::ConjunctionExpression_*,_false>._M_head_impl =
       (tuple<duckdb::ConjunctionExpression_*,_std::default_delete<duckdb::ConjunctionExpression>_>)
       (tuple<duckdb::ConjunctionExpression_*,_std::default_delete<duckdb::ConjunctionExpression>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::ConjunctionExpression_*,_std::default_delete<duckdb::ConjunctionExpression>_>
       .super__Head_base<0UL,_duckdb::ConjunctionExpression_*,_false>._M_head_impl;
  pCVar1 = unique_ptr<duckdb::ConjunctionExpression,_std::default_delete<duckdb::ConjunctionExpression>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpression,_std::default_delete<duckdb::ConjunctionExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (deserializer,200,"children",&pCVar1->children);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::ConjunctionExpression_*,_std::default_delete<duckdb::ConjunctionExpression>_>
       .super__Head_base<0UL,_duckdb::ConjunctionExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ConjunctionExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ConjunctionExpression>(new ConjunctionExpression(deserializer.Get<ExpressionType>()));
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(200, "children", result->children);
	return std::move(result);
}